

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_win_shared_query_
               (MPIABI_Fint *win,MPIABI_Fint *rank,MPIABI_Fint *size,int *disp_unit,void *baseptr,
               MPIABI_Fint *ierror)

{
  mpi_win_shared_query_();
  return;
}

Assistant:

void mpiabi_win_shared_query_(
  const MPIABI_Fint * win,
  const MPIABI_Fint * rank,
  MPIABI_Fint * size,
  int * disp_unit,
  void * baseptr,
  MPIABI_Fint * ierror
) {
  return mpi_win_shared_query_(
    win,
    rank,
    size,
    disp_unit,
    baseptr,
    ierror
  );
}